

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

void mpz_abs_sub_bit(__mpz_struct *d,mp_bitcnt_t bit_index)

{
  mp_ptr rp;
  uint uVar1;
  mp_limb_t *pmVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  mp_limb_t mVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = d->_mp_size;
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  uVar8 = (ulong)uVar4;
  uVar7 = bit_index >> 6;
  if (uVar8 < uVar7 || uVar8 - uVar7 == 0) {
    __assert_fail("limb_index < dn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0xdfe,"void mpz_abs_sub_bit(__mpz_struct *, mp_bitcnt_t)");
  }
  pmVar2 = d->_mp_d;
  rp = pmVar2 + uVar7;
  mVar6 = mpn_sub_1(rp,rp,uVar8 - uVar7,1L << ((byte)bit_index & 0x3f));
  if (mVar6 != 0) {
    __assert_fail("__cy == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0xe01,"void mpz_abs_sub_bit(__mpz_struct *, mp_bitcnt_t)");
  }
  do {
    if (pmVar2[uVar8 - 1] != 0) goto LAB_001069c9;
    bVar3 = 1 < (long)uVar8;
    uVar8 = uVar8 - 1;
  } while (bVar3);
  uVar8 = 0;
LAB_001069c9:
  iVar5 = -(int)uVar8;
  if (-1 < d->_mp_size) {
    iVar5 = (int)uVar8;
  }
  d->_mp_size = iVar5;
  return;
}

Assistant:

static void
mpz_abs_sub_bit (mpz_t d, mp_bitcnt_t bit_index)
{
  mp_size_t dn, limb_index;
  mp_ptr dp;
  mp_limb_t bit;

  dn = GMP_ABS (d->_mp_size);
  dp = d->_mp_d;

  limb_index = bit_index / GMP_LIMB_BITS;
  bit = (mp_limb_t) 1 << (bit_index % GMP_LIMB_BITS);

  assert (limb_index < dn);

  gmp_assert_nocarry (mpn_sub_1 (dp + limb_index, dp + limb_index,
				 dn - limb_index, bit));
  dn = mpn_normalized_size (dp, dn);
  d->_mp_size = (d->_mp_size < 0) ? - dn : dn;
}